

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O2

nbt_node * nbt_clone(nbt_node *tree)

{
  nbt_type nVar1;
  undefined8 uVar2;
  nbt_node *__ptr;
  char *__ptr_00;
  int *piVar3;
  nbt_list *pnVar4;
  uchar *__dest;
  size_t __n;
  size_t __size;
  
  if (tree == (nbt_node *)0x0) goto LAB_00103f91;
  nVar1 = tree->type;
  if (nVar1 == TAG_INVALID) {
    __assert_fail("tree->type != TAG_INVALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x85,"nbt_node *nbt_clone(nbt_node *)");
  }
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = -2;
    goto LAB_00103f91;
  }
  __ptr->type = nVar1;
  __ptr_00 = safe_strdup(tree->name);
  __ptr->name = __ptr_00;
  if ((__ptr_00 == (char *)0x0) && (tree->name != (char *)0x0)) goto LAB_00103f74;
  switch(tree->type) {
  case TAG_BYTE_ARRAY:
    __size = (size_t)(tree->payload).tag_byte_array.length;
    __n = __size;
    break;
  case TAG_STRING:
    pnVar4 = (nbt_list *)_nbt_strdup((tree->payload).tag_string);
    goto LAB_00104015;
  case TAG_LIST:
  case TAG_COMPOUND:
    pnVar4 = clone_list((tree->payload).tag_list);
LAB_00104015:
    (__ptr->payload).tag_list = pnVar4;
    if (pnVar4 != (nbt_list *)0x0) {
      return __ptr;
    }
    goto LAB_00103f74;
  case TAG_INT_ARRAY:
    __n = (size_t)(tree->payload).tag_byte_array.length;
    __size = __n * 4;
    break;
  default:
    uVar2 = *(undefined8 *)((long)&tree->payload + 8);
    (__ptr->payload).tag_long = (tree->payload).tag_long;
    *(undefined8 *)((long)&__ptr->payload + 8) = uVar2;
    return __ptr;
  }
  __dest = (uchar *)malloc(__size);
  if (__dest == (uchar *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = -2;
LAB_00103f74:
    free(__ptr_00);
    free(__ptr);
LAB_00103f91:
    __ptr = (nbt_node *)0x0;
  }
  else {
    memcpy(__dest,(tree->payload).tag_byte_array.data,__n);
    (__ptr->payload).tag_byte_array.data = __dest;
    (__ptr->payload).tag_byte_array.length = (int32_t)__n;
  }
  return __ptr;
}

Assistant:

nbt_node* nbt_clone(nbt_node* tree)
{
    if(tree == NULL) return NULL;
    assert(tree->type != TAG_INVALID);

    nbt_node* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, return NULL);

    ret->type = tree->type;
    ret->name = safe_strdup(tree->name);

    if(tree->name && ret->name == NULL) goto clone_error;

    if(tree->type == TAG_STRING)
    {
        ret->payload.tag_string = _nbt_strdup(tree->payload.tag_string);
        if(ret->payload.tag_string == NULL) goto clone_error;
    }

    else if(tree->type == TAG_BYTE_ARRAY)
    {
        unsigned char* newbuf;
        CHECKED_MALLOC(newbuf, tree->payload.tag_byte_array.length, goto clone_error);

        memcpy(newbuf,
               tree->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.length);

        ret->payload.tag_byte_array.data   = newbuf;
        ret->payload.tag_byte_array.length = tree->payload.tag_byte_array.length;
    }

    else if(tree->type == TAG_INT_ARRAY)
    {
        int32_t* newbuf;
        CHECKED_MALLOC(newbuf, tree->payload.tag_int_array.length * sizeof(int32_t), goto clone_error);

        memcpy(newbuf,
               tree->payload.tag_int_array.data,
               tree->payload.tag_int_array.length);

        ret->payload.tag_int_array.data   = newbuf;
        ret->payload.tag_int_array.length = tree->payload.tag_int_array.length;
    }

    else if(tree->type == TAG_LIST)
    {
        ret->payload.tag_list = clone_list(tree->payload.tag_list);
        if(ret->payload.tag_list == NULL) goto clone_error;
    }
    else if(tree->type == TAG_COMPOUND)
    {
        ret->payload.tag_compound = clone_list(tree->payload.tag_compound);
        if(ret->payload.tag_compound == NULL) goto clone_error;
    }
    else
    {
        ret->payload = tree->payload;
    }

    return ret;

clone_error:
    if(ret) free(ret->name);

    free(ret);
    return NULL;
}